

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

string * __thiscall
wabt::cat<char[7],wabt::string_view,char[2]>
          (string *__return_storage_ptr__,wabt *this,char (*args) [7],string_view *args_1,
          char (*args_2) [2])

{
  char (*args_local_2) [2];
  string_view *args_local_1;
  char (*args_local) [7];
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cat_compute_size<char[7],wabt::string_view,char[2]>
            ((char (*) [7])this,(string_view *)args,(char (*) [2])args_1);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[7],wabt::string_view,char[2]>
            (__return_storage_ptr__,(char (*) [7])this,(string_view *)args,(char (*) [2])args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
    std::string s;
    s.reserve(cat_compute_size(args...));
    cat_concatenate(s, args...);
    return s;
}